

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

Totals * __thiscall Catch::Totals::operator+=(Totals *this,Totals *other)

{
  Counts::operator+=(&this->assertions,&other->assertions);
  Counts::operator+=(&this->testCases,&other->testCases);
  return this;
}

Assistant:

Totals& Totals::operator += ( Totals const& other ) {
        assertions += other.assertions;
        testCases += other.testCases;
        return *this;
    }